

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeferredTypeHandler.h
# Opt level: O3

void __thiscall
Js::DeferredTypeHandlerBase::DeferredTypeHandlerBase
          (DeferredTypeHandlerBase *this,DeferredTypeHandlerBase *typeHandler)

{
  code *pcVar1;
  Type TVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  undefined4 *puVar6;
  
  (this->super_DynamicTypeHandler).propertyTypes =
       (typeHandler->super_DynamicTypeHandler).propertyTypes;
  (this->super_DynamicTypeHandler).flags = (typeHandler->super_DynamicTypeHandler).flags;
  (this->super_DynamicTypeHandler).offsetOfInlineSlots =
       (typeHandler->super_DynamicTypeHandler).offsetOfInlineSlots;
  (this->super_DynamicTypeHandler).slotCapacity =
       (typeHandler->super_DynamicTypeHandler).slotCapacity;
  TVar2 = (typeHandler->super_DynamicTypeHandler).inlineSlotCapacity;
  (this->super_DynamicTypeHandler).unusedBytes = (typeHandler->super_DynamicTypeHandler).unusedBytes
  ;
  (this->super_DynamicTypeHandler).inlineSlotCapacity = TVar2;
  (this->super_DynamicTypeHandler).protoCachesWereInvalidated = false;
  (this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler = (_func_int **)&PTR_GetCppName_014f5608
  ;
  bVar3 = DynamicTypeHandler::GetPropertyTypes(&this->super_DynamicTypeHandler);
  bVar4 = DynamicTypeHandler::GetPropertyTypes(&typeHandler->super_DynamicTypeHandler);
  if ((bVar3 & 0x10) >> 4 != (bVar4 & 0x10) >> 4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/DeferredTypeHandler.h"
                                ,0x1a,
                                "(this->GetHasOnlyWritableDataProperties() == typeHandler->GetHasOnlyWritableDataProperties())"
                                ,
                                "this->GetHasOnlyWritableDataProperties() == typeHandler->GetHasOnlyWritableDataProperties()"
                               );
    if (!bVar5) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  return;
}

Assistant:

DeferredTypeHandlerBase(DeferredTypeHandlerBase * typeHandler) : DynamicTypeHandler(typeHandler)
        {
            Assert(this->GetIsInlineSlotCapacityLocked() == typeHandler->GetIsInlineSlotCapacityLocked());
            Assert(this->GetHasOnlyWritableDataProperties() == typeHandler->GetHasOnlyWritableDataProperties());
        }